

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

ExprNode * __thiscall Translator::visit(Translator *this,CallNode *callNode)

{
  int iVar1;
  undefined4 extraout_var;
  ExpList *this_00;
  CALL *this_01;
  NAME *this_02;
  Label *this_03;
  ExpList *next;
  ExpListNode *pEVar2;
  char callLabel [200];
  char acStack_f8 [200];
  
  pEVar2 = callNode->parameters;
  if (pEVar2 == (ExpListNode *)0x0) {
    this_00 = (ExpList *)0x0;
  }
  else {
    next = (ExpList *)0x0;
    do {
      iVar1 = (*(pEVar2->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(pEVar2->exp,this);
      this_00 = (ExpList *)operator_new(0x20);
      ExpList::ExpList(this_00,(ExprNode *)CONCAT44(extraout_var,iVar1),next);
      pEVar2 = pEVar2->next;
      next = this_00;
    } while (pEVar2 != (ExpListNode *)0x0);
  }
  sprintf(acStack_f8,"func_%s_call",(callNode->id->super_ExpNode).lexeme);
  this_01 = (CALL *)operator_new(0x20);
  this_02 = (NAME *)operator_new(0x18);
  this_03 = (Label *)operator_new(0x10);
  Label::Label(this_03,acStack_f8);
  NAME::NAME(this_02,this_03);
  CALL::CALL(this_01,(ExprNode *)this_02,this_00);
  return &this_01->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(CallNode *callNode) {
    ExpListNode *param = callNode->getParameters(); // pega os parametros da chamada
    ExpList *lcall = NULL;
    while (param) {// se tiver parametros
        ExprNode *exp = param->getExp()->accept(this);// acessa o no
        lcall = new ExpList(exp, lcall);// cria uma lista de exp
        param = param->getNext();// vai para o proximo param
    }
    char callLabel[200];
    sprintf(callLabel, "func_%s_call", callNode->getId()->getLexeme());// cria um label para a chamada
    return new CALL(new NAME(new Label(callLabel)), lcall);// cria o call node com a funcao e seus parametros
}